

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cc
# Opt level: O0

string * __thiscall
phosg::StringReader::all_abi_cxx11_(string *__return_storage_ptr__,StringReader *this)

{
  uint8_t *__s;
  size_type __n;
  allocator<char> local_19;
  StringReader *local_18;
  StringReader *this_local;
  
  __s = this->data;
  __n = this->length;
  local_18 = this;
  this_local = (StringReader *)__return_storage_ptr__;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,(char *)__s,__n,&local_19);
  ::std::allocator<char>::~allocator(&local_19);
  return __return_storage_ptr__;
}

Assistant:

string StringReader::all() const {
  return string(reinterpret_cast<const char*>(this->data), this->length);
}